

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O1

void freeVariables(void)

{
  variable *pvVar1;
  variable *__ptr;
  
  __ptr = variables_first;
  if (variables_first != (variable *)0x0) {
    do {
      pvVar1 = __ptr->next;
      variables_first = pvVar1;
      free(__ptr->key);
      free(__ptr);
      __ptr = pvVar1;
    } while (pvVar1 != (variable *)0x0);
  }
  return;
}

Assistant:

void freeVariables(void)
{
    struct variable *var;

    while ((var = variables_first) != NULL) {
        variables_first = variables_first->next;
        free(var->key);
        free(var);
    }

    free(variables_first);
}